

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

Vec_Wrd_t * Abc_SuppDiffMatrix(Vec_Wrd_t *vCubes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  word *pwVar5;
  Vec_Wrd_t *p;
  Vec_Wrd_t *p_00;
  abctime aVar6;
  word *local_48;
  word *pStore;
  Vec_Wrd_t *vPairs;
  Vec_Wrd_t *vRes;
  word *pLimit;
  word *pEnt;
  word *pEnt2;
  abctime clk;
  Vec_Wrd_t *vCubes_local;
  
  aVar4 = Abc_Clock();
  pLimit = Vec_WrdArray(vCubes);
  pwVar5 = Vec_WrdLimit(vCubes);
  iVar1 = Vec_WrdSize(vCubes);
  iVar2 = Vec_WrdSize(vCubes);
  p = Vec_WrdAlloc((iVar1 * (iVar2 + -1)) / 2);
  local_48 = Vec_WrdArray(p);
  for (; pEnt = pLimit, pLimit < pwVar5; pLimit = pLimit + 1) {
    while (pEnt = pEnt + 1, pEnt < pwVar5) {
      *local_48 = *pLimit ^ *pEnt;
      local_48 = local_48 + 1;
    }
  }
  iVar1 = Vec_WrdCap(p);
  p->nSize = iVar1;
  pwVar5 = Vec_WrdLimit(p);
  if (local_48 != pwVar5) {
    __assert_fail("pStore == Vec_WrdLimit(vPairs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilSupp.c"
                  ,0x176,"Vec_Wrd_t *Abc_SuppDiffMatrix(Vec_Wrd_t *)");
  }
  p_00 = Vec_WrdDup(p);
  uVar3 = Vec_WrdSize(p_00);
  iVar1 = Vec_WrdSize(p_00);
  iVar2 = Vec_WrdSize(p);
  printf("Successfully generated diff matrix with %10d rows (%6.2f %%).  ",
         ((double)iVar1 * 100.0) / (double)iVar2,(ulong)uVar3);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar4);
  Vec_WrdFree(p);
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_SuppDiffMatrix( Vec_Wrd_t * vCubes )
{
    abctime clk = Abc_Clock();
    word * pEnt2, * pEnt = Vec_WrdArray( vCubes );
    word * pLimit = Vec_WrdLimit( vCubes );
    Vec_Wrd_t * vRes, * vPairs = Vec_WrdAlloc( Vec_WrdSize(vCubes) * (Vec_WrdSize(vCubes) - 1) / 2 );
    word * pStore = Vec_WrdArray( vPairs );
    for ( ; pEnt < pLimit; pEnt++ )
    for ( pEnt2 = pEnt+1; pEnt2 < pLimit; pEnt2++ )
        *pStore++ = *pEnt ^ *pEnt2;
    vPairs->nSize = Vec_WrdCap(vPairs);
    assert( pStore == Vec_WrdLimit(vPairs) );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    vRes = Vec_WrdUniqifyHash( vPairs, 1 );
    vRes = Vec_WrdDup( vPairs );
    printf( "Successfully generated diff matrix with %10d rows (%6.2f %%).  ", 
        Vec_WrdSize(vRes), 100.0 * Vec_WrdSize(vRes) / Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WrdFree( vPairs );
    return vRes;    
}